

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio.c
# Opt level: O0

archive_string_conv * get_sconv(archive_write *a,zip_conflict *zip)

{
  archive_string_conv *paVar1;
  long in_RSI;
  archive *in_RDI;
  undefined8 local_8;
  
  if (*(long *)(in_RSI + 0x90) == 0) {
    if (*(int *)(in_RSI + 0xa4) == 0) {
      paVar1 = archive_string_default_conversion_for_write(in_RDI);
      *(archive_string_conv **)(in_RSI + 0x98) = paVar1;
      *(undefined4 *)(in_RSI + 0xa4) = 1;
    }
    local_8 = *(archive_string_conv **)(in_RSI + 0x98);
  }
  else {
    local_8 = *(archive_string_conv **)(in_RSI + 0x90);
  }
  return local_8;
}

Assistant:

static struct archive_string_conv *
get_sconv(struct archive_write *a)
{
	struct cpio *cpio;
	struct archive_string_conv *sconv;

	cpio = (struct cpio *)a->format_data;
	sconv = cpio->opt_sconv;
	if (sconv == NULL) {
		if (!cpio->init_default_conversion) {
			cpio->sconv_default =
			    archive_string_default_conversion_for_write(
			      &(a->archive));
			cpio->init_default_conversion = 1;
		}
		sconv = cpio->sconv_default;
	}
	return (sconv);
}